

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int fits_decomp_img(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  FITSfile *pFVar1;
  double *nulval;
  int iVar2;
  void *array;
  long lVar3;
  char *err_message;
  long lVar4;
  long lVar5;
  long nelem;
  int local_ec;
  float fnulval;
  int anynul;
  double *local_e0;
  undefined8 local_d8;
  double dnulval;
  long inc [6];
  LONGLONG lpixel [6];
  LONGLONG fpixel [6];
  
  if (0 < *status) {
    return *status;
  }
  iVar2 = fits_is_compressed_image(infptr,status);
  if (iVar2 == 0) {
    ffpmsg("CHDU is not a compressed image (fits_decompress_img)");
    *status = 0x19e;
    return 0x19e;
  }
  pFVar1 = infptr->Fptr;
  iVar2 = ffcrim(outfptr,pFVar1->zbitpix,pFVar1->zndim,pFVar1->znaxis,status);
  if (iVar2 < 1) {
    iVar2 = imcomp_copy_imheader(infptr,outfptr,status);
    if (iVar2 < 1) {
      ffrdef(outfptr,status);
      ffpscl(outfptr,1.0,0.0,status);
      ffpscl(infptr,1.0,0.0,status);
      pFVar1 = infptr->Fptr;
      iVar2 = pFVar1->zbitpix;
      local_e0 = (double *)&fnulval;
      if (iVar2 < 8) {
        if (iVar2 == -0x40) {
          local_e0 = &dnulval;
          dnulval = -9.1191291391491e-36;
          local_ec = 1;
          lVar4 = 8;
          local_d8 = 0x52;
        }
        else if (iVar2 == -0x20) {
          fnulval = -9.11912e-36;
          local_ec = 1;
          lVar4 = 4;
          local_d8 = 0x2a;
        }
        else {
LAB_0018d3b7:
          local_d8 = 0;
          lVar4 = 0;
          local_ec = 0;
        }
      }
      else if (iVar2 == 8) {
        local_ec = 0;
        lVar4 = 1;
        local_d8 = 0xb;
      }
      else if (iVar2 == 0x20) {
        local_ec = 0;
        lVar4 = 4;
        local_d8 = 0x1f;
      }
      else {
        if (iVar2 != 0x10) goto LAB_0018d3b7;
        local_ec = 0;
        lVar4 = 2;
        local_d8 = 0x15;
      }
      lVar5 = (long)pFVar1->zndim;
      if (lVar5 < 1) {
        nelem = 1;
      }
      else {
        memcpy(lpixel,pFVar1->znaxis,lVar5 * 8);
        lVar3 = 0;
        nelem = 1;
        do {
          nelem = nelem * pFVar1->znaxis[lVar3];
          fpixel[lVar3] = 1;
          inc[lVar3] = 1;
          lVar3 = lVar3 + 1;
        } while (lVar5 != lVar3);
      }
      array = calloc((lVar4 * nelem - 1U >> 3) + 1,8);
      nulval = local_e0;
      if (array == (void *)0x0) {
        ffpmsg("Couldn\'t allocate memory for the uncompressed image");
        *status = 0x71;
        return 0x71;
      }
      iVar2 = (int)local_d8;
      fits_read_compressed_img
                (infptr,iVar2,fpixel,lpixel,inc,local_ec,local_e0,array,(char *)0x0,&anynul,status);
      if (anynul == 0) {
        ffppr(outfptr,iVar2,1,nelem,array,status);
      }
      else {
        ffppn(outfptr,iVar2,1,nelem,array,nulval,status);
      }
      free(array);
      goto LAB_0018d2b0;
    }
    err_message = "error copying header of compressed image";
  }
  else {
    err_message = "error creating output decompressed image HDU";
  }
  ffpmsg(err_message);
LAB_0018d2b0:
  return *status;
}

Assistant:

int fits_decompress_img (fitsfile *infptr, /* image (bintable) to uncompress */
              fitsfile *outfptr,   /* empty HDU for output uncompressed image */
              int *status)         /* IO - error status               */

/* 
  THIS IS AN OBSOLETE ROUTINE.  USE fits_img_decompress instead!!!
  
  This routine decompresses the whole image and writes it to the output file.
*/

{
    double *data;
    int ii, datatype = 0, byte_per_pix = 0;
    int nullcheck, anynul;
    LONGLONG fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long inc[MAX_COMPRESS_DIM];
    long imgsize, memsize;
    float *nulladdr, fnulval;
    double dnulval;

    if (*status > 0)
        return(*status);

    if (!fits_is_compressed_image(infptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_decompress_img)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    /* create an empty output image with the correct dimensions */
    if (ffcrim(outfptr, (infptr->Fptr)->zbitpix, (infptr->Fptr)->zndim, 
       (infptr->Fptr)->znaxis, status) > 0)
    {
        ffpmsg("error creating output decompressed image HDU");
    	return (*status);
    }
    /* Copy the table header to the image header. */
    if (imcomp_copy_imheader(infptr, outfptr, status) > 0)
    {
        ffpmsg("error copying header of compressed image");
    	return (*status);
    }

    /* force a rescan of the output header keywords, then reset the scaling */
    /* in case the BSCALE and BZERO keywords are present, so that the       */
    /* decompressed values won't be scaled when written to the output image */
    ffrdef(outfptr, status);
    ffpscl(outfptr, 1.0, 0.0, status);
    ffpscl(infptr, 1.0, 0.0, status);

    /* initialize; no null checking is needed for integer images */
    nullcheck = 0;
    nulladdr =  &fnulval;

    /* determine datatype for image */
    if ((infptr->Fptr)->zbitpix == BYTE_IMG)
    {
        datatype = TBYTE;
        byte_per_pix = 1;
    }
    else if ((infptr->Fptr)->zbitpix == SHORT_IMG)
    {
        datatype = TSHORT;
        byte_per_pix = sizeof(short);
    }
    else if ((infptr->Fptr)->zbitpix == LONG_IMG)
    {
        datatype = TINT;
        byte_per_pix = sizeof(int);
    }
    else if ((infptr->Fptr)->zbitpix == FLOAT_IMG)
    {
        /* In the case of float images we must check for NaNs  */
        nullcheck = 1;
        fnulval = FLOATNULLVALUE;
        nulladdr =  &fnulval;
        datatype = TFLOAT;
        byte_per_pix = sizeof(float);
    }
    else if ((infptr->Fptr)->zbitpix == DOUBLE_IMG)
    {
        /* In the case of double images we must check for NaNs  */
        nullcheck = 1;
        dnulval = DOUBLENULLVALUE;
        nulladdr = (float *) &dnulval;
        datatype = TDOUBLE;
        byte_per_pix = sizeof(double);
    }

    /* calculate size of the image (in pixels) */
    imgsize = 1;
    for (ii = 0; ii < (infptr->Fptr)->zndim; ii++)
    {
        imgsize *= (infptr->Fptr)->znaxis[ii];
        fpixel[ii] = 1;              /* Set first and last pixel to */
        lpixel[ii] = (infptr->Fptr)->znaxis[ii]; /* include the entire image. */
        inc[ii] = 1;
    }
    /* Calc equivalent number of double pixels same size as whole the image. */
    /* We use double datatype to force the memory to be aligned properly */
    memsize = ((imgsize * byte_per_pix) - 1) / sizeof(double) + 1;

    /* allocate memory for the image */
    data = (double*) calloc (memsize, sizeof(double));
    if (!data)
    { 
        ffpmsg("Couldn't allocate memory for the uncompressed image");
        return(*status = MEMORY_ALLOCATION);
    }

    /* uncompress the entire image into memory */
    /* This routine should be enhanced sometime to only need enough */
    /* memory to uncompress one tile at a time.  */
    fits_read_compressed_img(infptr, datatype, fpixel, lpixel, inc,  
            nullcheck, nulladdr, data, NULL, &anynul, status);

    /* write the image to the output file */
    if (anynul)
        fits_write_imgnull(outfptr, datatype, 1, imgsize, data, nulladdr, 
                          status);
    else
        fits_write_img(outfptr, datatype, 1, imgsize, data, status);

    free(data);
    return (*status);
}